

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf-type.c
# Opt level: O3

coda_dynamic_type *
coda_cdf_variable_new
          (int32_t data_type,int32_t max_rec,int32_t rec_varys,int32_t num_dims,int32_t *dim,
          int32_t *dim_varys,coda_array_ordering array_ordering,int32_t num_elements,
          int sparse_rec_method,int has_compression,coda_cdf_variable **variable)

{
  size_t __size;
  ulong uVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  coda_cdf_variable *type;
  int64_t *__s;
  coda_cdf_time *pcVar6;
  coda_cdf_type *type_00;
  coda_type_array *type_01;
  long lVar7;
  ulong uVar8;
  int32_t data_type_00;
  bool bVar9;
  bool bVar10;
  int32_t local_4c;
  
  if (max_rec != 0 && rec_varys == 0) {
    __assert_fail("rec_varys || max_rec == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-type.c"
                  ,0x10c,
                  "coda_dynamic_type *coda_cdf_variable_new(int32_t, int32_t, int32_t, int32_t, int32_t *, int32_t *, coda_array_ordering, int32_t, int, int, coda_cdf_variable **)"
                 );
  }
  type = (coda_cdf_variable *)malloc(0x50);
  if (type == (coda_cdf_variable *)0x0) {
    coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",0x50,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-type.c"
                   ,0x112);
    return (coda_dynamic_type *)0x0;
  }
  type->backend = coda_backend_cdf;
  type->definition = (coda_type_array *)0x0;
  type->tag = tag_cdf_variable;
  type->attributes = (coda_mem_record *)0x0;
  type->base_type = (coda_cdf_type *)0x0;
  type->num_records = 1;
  type->num_values_per_record = 1;
  type->value_size = -1;
  type->sparse_rec_method = sparse_rec_method;
  type->has_compression = has_compression;
  type->offset = (int64_t *)0x0;
  type->data = (int8_t *)0x0;
  if (rec_varys == 0) {
    if (num_dims < 1) {
      bVar9 = true;
    }
    else {
      lVar7 = 0;
      do {
        bVar9 = dim_varys[lVar7] == 0;
        if (!bVar9) break;
        bVar10 = (ulong)(uint)num_dims - 1 != lVar7;
        lVar7 = lVar7 + 1;
      } while (bVar10);
    }
  }
  else {
    bVar9 = false;
  }
  local_4c = data_type;
  if (data_type == 0x21) {
    bVar2 = 1;
    bVar10 = false;
    data_type_00 = 8;
  }
  else if (data_type == 0x1f) {
    bVar2 = 1;
    bVar10 = false;
    data_type_00 = 0x2d;
  }
  else {
    local_4c = -1;
    bVar10 = true;
    bVar2 = 0;
    data_type_00 = data_type;
  }
  if (bVar9) {
    iVar3 = basic_type_init((coda_cdf_type *)type,data_type_00,num_elements);
    if (iVar3 != 0) goto LAB_0018792e;
    uVar1 = type->definition->bit_size;
    uVar8 = uVar1 + 7;
    if (-1 < (long)uVar1) {
      uVar8 = uVar1;
    }
    type->value_size = (int)(uVar8 >> 3);
LAB_0018784a:
    iVar3 = type->num_records;
    __size = (long)iVar3 * 8;
    __s = (int64_t *)malloc(__size);
    type->offset = __s;
    if (__s == (int64_t *)0x0) {
      coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",__size,
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-type.c"
                     ,0x189);
      coda_cdf_type_delete((coda_dynamic_type *)type);
      return (coda_dynamic_type *)0x0;
    }
    if (0 < iVar3) {
      memset(__s,0xff,__size);
    }
    *variable = type;
    if (!(bool)(bVar9 & bVar2)) {
      return (coda_dynamic_type *)type;
    }
    pcVar6 = time_type_new(local_4c,(coda_cdf_type *)type);
    if (pcVar6 != (coda_cdf_time *)0x0) {
      return (coda_dynamic_type *)pcVar6;
    }
  }
  else {
    type_00 = (coda_cdf_type *)malloc(0x18);
    if (type_00 == (coda_cdf_type *)0x0) {
      coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",0x18,
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-type.c"
                     ,0xbf);
    }
    else {
      type_00->backend = coda_backend_cdf;
      type_00->definition = (coda_type *)0x0;
      type_00->tag = tag_cdf_basic_type;
      iVar3 = basic_type_init(type_00,data_type_00,num_elements);
      if (iVar3 == 0) {
        type->base_type = type_00;
        if (!bVar10) {
          pcVar6 = time_type_new(local_4c,type_00);
          if (pcVar6 == (coda_cdf_time *)0x0) goto LAB_0018792e;
          type->base_type = (coda_cdf_type *)pcVar6;
        }
        type_01 = coda_type_array_new(coda_format_cdf);
        type->definition = type_01;
        if ((type_01 == (coda_type_array *)0x0) ||
           (iVar3 = coda_type_array_set_base_type(type_01,type->base_type->definition), iVar3 != 0))
        goto LAB_0018792e;
        if (rec_varys != 0) {
          iVar3 = coda_type_array_add_fixed_dimension(type->definition,(long)(max_rec + 1));
          if (iVar3 != 0) goto LAB_0018792e;
          type->num_records = max_rec + 1;
        }
        uVar1 = type->base_type->definition->bit_size;
        uVar8 = uVar1 + 7;
        if (-1 < (long)uVar1) {
          uVar8 = uVar1;
        }
        type->value_size = (int)(uVar8 >> 3);
        if (0 < num_dims) {
          iVar3 = 0;
          do {
            num_dims = num_dims + -1;
            iVar4 = num_dims;
            if (array_ordering == coda_array_ordering_c) {
              iVar4 = iVar3;
            }
            if (dim_varys[iVar4] != 0) {
              iVar5 = coda_type_array_add_fixed_dimension(type->definition,(long)dim[iVar4]);
              if (iVar5 != 0) goto LAB_0018792e;
              type->num_values_per_record = type->num_values_per_record * dim[iVar4];
            }
            iVar3 = iVar3 + 1;
          } while (num_dims != 0);
        }
        iVar3 = coda_type_array_validate(type->definition);
        if (iVar3 != 0) goto LAB_0018792e;
        goto LAB_0018784a;
      }
      coda_cdf_type_delete((coda_dynamic_type *)type_00);
    }
    type->base_type = (coda_cdf_type *)0x0;
  }
LAB_0018792e:
  coda_cdf_type_delete((coda_dynamic_type *)type);
  return (coda_dynamic_type *)0x0;
}

Assistant:

coda_dynamic_type *coda_cdf_variable_new(int32_t data_type, int32_t max_rec, int32_t rec_varys, int32_t num_dims,
                                         int32_t dim[CODA_MAX_NUM_DIMS], int32_t dim_varys[CODA_MAX_NUM_DIMS],
                                         coda_array_ordering array_ordering, int32_t num_elements,
                                         int sparse_rec_method, int has_compression, coda_cdf_variable **variable)
{
    coda_cdf_variable *type;
    int is_scalar = 0;
    int time_type = -1;
    int i;

    assert(rec_varys || max_rec == 0);

    type = (coda_cdf_variable *)malloc(sizeof(coda_cdf_variable));
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       (long)sizeof(coda_cdf_variable), __FILE__, __LINE__);
        return NULL;
    }
    type->backend = coda_backend_cdf;
    type->definition = NULL;
    type->tag = tag_cdf_variable;
    type->attributes = NULL;
    type->base_type = NULL;
    type->num_records = 1;
    type->num_values_per_record = 1;
    type->value_size = -1;
    type->sparse_rec_method = sparse_rec_method;
    type->has_compression = has_compression;
    type->offset = NULL;
    type->data = NULL;

    if (!rec_varys)
    {
        is_scalar = 1;
        for (i = 0; i < num_dims; i++)
        {
            if (dim_varys[i])
            {
                is_scalar = 0;
                break;
            }
        }
    }
    if (data_type == 31 || data_type == 33)
    {
        time_type = data_type;
        if (data_type == 31)
        {
            /* EPOCH */
            data_type = 45;
        }
        else
        {
            /* TIME_TT2000 */
            data_type = 8;
        }
    }

    if (is_scalar)
    {
        if (basic_type_init((coda_cdf_type *)type, data_type, num_elements) != 0)
        {
            coda_cdf_type_delete((coda_dynamic_type *)type);
            return NULL;
        }
        type->value_size = (int)(type->definition->bit_size / 8);
    }
    else
    {
        type->base_type = basic_type_new(data_type, num_elements);
        if (type->base_type == NULL)
        {
            coda_cdf_type_delete((coda_dynamic_type *)type);
            return NULL;
        }
        if (time_type != -1)
        {
            coda_cdf_time *base_type;

            base_type = time_type_new(time_type, type->base_type);
            if (base_type == NULL)
            {
                coda_cdf_type_delete((coda_dynamic_type *)type);
                return NULL;
            }
            type->base_type = (coda_cdf_type *)base_type;
        }
        type->definition = coda_type_array_new(coda_format_cdf);
        if (type->definition == NULL)
        {
            coda_cdf_type_delete((coda_dynamic_type *)type);
            return NULL;
        }
        if (coda_type_array_set_base_type(type->definition, type->base_type->definition) != 0)
        {
            coda_cdf_type_delete((coda_dynamic_type *)type);
            return NULL;
        }
        if (rec_varys)
        {
            if (coda_type_array_add_fixed_dimension(type->definition, max_rec + 1) != 0)
            {
                coda_cdf_type_delete((coda_dynamic_type *)type);
                return NULL;
            }
            type->num_records = max_rec + 1;
        }
        type->value_size = (int)(type->base_type->definition->bit_size / 8);
        for (i = 0; i < num_dims; i++)
        {
            /* make sure that we always add the dimensions using C array ordering */
            int dim_id = (array_ordering == coda_array_ordering_c ? i : num_dims - 1 - i);

            if (dim_varys[dim_id])
            {
                if (coda_type_array_add_fixed_dimension(type->definition, dim[dim_id]) != 0)
                {
                    coda_cdf_type_delete((coda_dynamic_type *)type);
                    return NULL;
                }
                type->num_values_per_record *= dim[dim_id];
            }
        }
        if (coda_type_array_validate(type->definition) != 0)
        {
            coda_cdf_type_delete((coda_dynamic_type *)type);
            return NULL;
        }
    }

    type->offset = malloc(type->num_records * sizeof(int64_t));
    if (type->offset == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       type->num_records * sizeof(int64_t), __FILE__, __LINE__);
        coda_cdf_type_delete((coda_dynamic_type *)type);
        return NULL;
    }
    for (i = 0; i < type->num_records; i++)
    {
        type->offset[i] = -1;
    }

    *variable = type;

    if (is_scalar && time_type != -1)
    {
        coda_cdf_time *special_type;

        special_type = time_type_new(time_type, (coda_cdf_type *)type);
        if (special_type == NULL)
        {
            coda_cdf_type_delete((coda_dynamic_type *)type);
            return NULL;
        }
        return (coda_dynamic_type *)special_type;
    }

    return (coda_dynamic_type *)type;
}